

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Communicator.hpp
# Opt level: O1

void __thiscall
OpenMD::Communicator<(OpenMD::communicatorType)2>::Communicator
          (Communicator<(OpenMD::communicatorType)2> *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  int myRank;
  int nProc;
  int local_20;
  int local_1c;
  
  MPI_Comm_size(&ompi_mpi_comm_world,&local_1c);
  MPI_Comm_rank(&ompi_mpi_comm_world);
  dVar4 = (double)local_1c;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  if ((int)dVar4 < 1) {
    iVar1 = 0;
  }
  else {
    iVar1 = 0;
    iVar2 = 1;
    do {
      if (local_1c % iVar2 == 0) {
        iVar1 = iVar2;
      }
      bVar3 = iVar2 != (int)dVar4;
      iVar2 = iVar2 + 1;
    } while (bVar3);
  }
  this->rowIndex_ = local_20 / iVar1;
  this->columnIndex_ = (int)((long)local_20 % (long)iVar1);
  MPI_Comm_split(&ompi_mpi_comm_world,(long)local_20 % (long)iVar1 & 0xffffffff,0,&this->myComm);
  return;
}

Assistant:

Communicator<D>() {
      int nProc;
      int myRank;

      MPI_Comm_size(MPI_COMM_WORLD, &nProc);
      MPI_Comm_rank(MPI_COMM_WORLD, &myRank);

      int nColumnsMax = (int)sqrt(RealType(nProc));

      int nColumns(0);
      for (int i = 1; i < nColumnsMax + 1; i++) {
        if (nProc % i == 0) nColumns = i;
      }

      // int nRows = nProc / nColumns;
      rowIndex_    = myRank / nColumns;
      columnIndex_ = myRank % nColumns;

      switch (D) {
      case Row:
        MPI_Comm_split(MPI_COMM_WORLD, rowIndex_, 0, &myComm);
        break;
      case Column:
        MPI_Comm_split(MPI_COMM_WORLD, columnIndex_, 0, &myComm);
        break;
      case Global:
        MPI_Comm_split(MPI_COMM_WORLD, myRank, 0, &myComm);
      }
    }